

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O1

int ffppruj(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,unsigned_long *array,
           int *status)

{
  int iVar1;
  LONGLONG firstrow;
  unsigned_long nullvalue;
  
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    firstrow = 1;
    if (1 < group) {
      firstrow = group;
    }
    ffpcluj(fptr,2,firstrow,firstelem,nelem,array,status);
  }
  else {
    fits_write_compressed_pixels(fptr,0x28,firstelem,nelem,0,array,&nullvalue,status);
  }
  return *status;
}

Assistant:

int ffppruj( fitsfile *fptr,  /* I - FITS file pointer                       */
            long  group,     /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
   unsigned long  *array,    /* I - array of values that are written        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
*/
{
    long row;
    unsigned long nullvalue;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        fits_write_compressed_pixels(fptr, TULONG, firstelem, nelem,
            0, array, &nullvalue, status);
        return(*status);
    }

    row=maxvalue(1,group);

    ffpcluj(fptr, 2, row, firstelem, nelem, array, status);
    return(*status);
}